

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O3

map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
* __thiscall
capnp::anon_unknown_1::CapnpcCppMain::makeBrandDepMap
          (map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
           *__return_storage_ptr__,CapnpcCppMain *this,TemplateContext *templateContext,
          Schema schema)

{
  _Rb_tree_header *p_Var1;
  ushort uVar2;
  char *pcVar3;
  size_t sVar4;
  ArrayDisposer *pAVar5;
  Branch *pBVar6;
  Method method_00;
  Method method_01;
  Schema SVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  undefined8 uVar11;
  Maybe<kj::StringTree> *pMVar12;
  mapped_type *pmVar13;
  undefined4 extraout_var;
  Schema SVar14;
  StructSchema SVar15;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ElementCount index;
  uint index_00;
  unsigned_long i_1;
  unsigned_long i;
  ulong uVar16;
  Type TVar17;
  StringPtr suffix;
  StringPtr suffix_00;
  uint location_2;
  Method method;
  uint location_1;
  InterfaceSchema interface;
  uint location;
  MethodList methods;
  uint local_204;
  Maybe<kj::StringTree> local_200;
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [48];
  map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
  *local_180;
  Schema local_178;
  Schema local_170;
  anon_union_56_1_a8c68091_for_NullableValue<kj::StringTree>_2 local_168;
  Schema local_130;
  RawBrandedSchema *local_128;
  undefined2 uStack_120;
  undefined4 uStack_11e;
  undefined2 uStack_11a;
  SegmentReader *local_118;
  WirePointer *pWStack_110;
  ArrayDisposer *local_108;
  WirePointer *pWStack_100;
  StructDataBitCount local_f8;
  StructPointerCount SStack_f4;
  undefined2 uStack_f2;
  MethodList *pMStack_f0;
  SuperclassList local_e0;
  RawBrandedSchema *local_a8;
  CapTableReader *pCStack_a0;
  SegmentReader *local_98;
  WirePointer *pWStack_90;
  ArrayDisposer *local_88;
  WirePointer *pWStack_80;
  StructDataBitCount local_78;
  StructPointerCount SStack_74;
  undefined2 uStack_72;
  MethodList *pMStack_70;
  MethodList local_68;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_180 = __return_storage_ptr__;
  local_178.raw = (RawBrandedSchema *)templateContext;
  uVar11 = Schema::getProto((Reader *)local_1c0,&local_178);
  if (0x6f < (uint)local_1b0._16_4_) {
    uVar2 = *(ushort *)(local_1b0._0_8_ + 0xc);
    if (uVar2 == 1) {
      local_1c0._0_8_ = Schema::asStruct(&local_178);
      uVar11 = StructSchema::getFields((FieldList *)&local_e0,(StructSchema *)local_1c0);
      if (local_e0.list.reader.elementCount != 0) {
        index_00 = 0;
        do {
          SVar14.raw._4_4_ = local_e0.parent.super_Schema.raw._4_4_;
          SVar14.raw._0_4_ = local_e0.parent.super_Schema.raw._0_4_;
          _::ListReader::getStructElement((StructReader *)local_1b0,&local_e0.list.reader,index_00);
          local_1c0._8_4_ = index_00;
          local_68.parent.super_Schema.raw._0_4_ = index_00 | 0x1000000;
          local_1c0._0_8_ = SVar14.raw;
          TVar17 = StructSchema::Field::getType((Field *)local_1c0);
          pMVar12 = makeBrandDepInitializer((Maybe<kj::StringTree> *)&local_170,this,TVar17);
          local_200.ptr.isSet = local_170.raw._0_1_;
          uVar11 = (MethodList *)CONCAT71((int7)((ulong)pMVar12 >> 8),local_170.raw._0_1_);
          if (local_170.raw._0_1_ == true) {
            local_200.ptr.field_1.value.size_ = local_168.value.size_;
            local_200.ptr.field_1.value.text.content.ptr = local_168.value.text.content.ptr;
            local_200.ptr.field_1.value.text.content.size_ = local_168.value.text.content.size_;
            local_168.value.text.content.ptr = (char *)0x0;
            local_168.value.text.content.size_ = 0;
            local_200.ptr.field_1.value.text.content.disposer =
                 local_168.value.text.content.disposer;
            local_200.ptr.field_1.value.branches.ptr = local_168.value.branches.ptr;
            local_200.ptr.field_1.value.branches.size_ = local_168.value.branches.size_;
            local_200.ptr.field_1.value.branches.disposer = local_168.value.branches.disposer;
            pmVar13 = std::
                      map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
                      ::operator[](local_180,(key_type_conflict *)&local_68);
            pmVar13->size_ = local_200.ptr.field_1.value.size_;
            pcVar3 = (pmVar13->text).content.ptr;
            if (pcVar3 != (char *)0x0) {
              sVar4 = (pmVar13->text).content.size_;
              (pmVar13->text).content.ptr = (char *)0x0;
              (pmVar13->text).content.size_ = 0;
              pAVar5 = (pmVar13->text).content.disposer;
              (**pAVar5->_vptr_ArrayDisposer)(pAVar5,pcVar3,1,sVar4,sVar4,0);
            }
            (pmVar13->text).content.ptr = local_200.ptr.field_1.value.text.content.ptr;
            (pmVar13->text).content.size_ = local_200.ptr.field_1.value.text.content.size_;
            (pmVar13->text).content.disposer = local_200.ptr.field_1.value.text.content.disposer;
            local_200.ptr.field_1.value.text.content.ptr = (char *)0x0;
            local_200.ptr.field_1.value.text.content.size_ = 0;
            pBVar6 = (pmVar13->branches).ptr;
            if (pBVar6 != (Branch *)0x0) {
              sVar4 = (pmVar13->branches).size_;
              (pmVar13->branches).ptr = (Branch *)0x0;
              (pmVar13->branches).size_ = 0;
              pAVar5 = (pmVar13->branches).disposer;
              (**pAVar5->_vptr_ArrayDisposer)(pAVar5,pBVar6,0x40,sVar4,sVar4);
            }
            uVar9 = local_200.ptr.field_1.value.text.content.size_;
            uVar8 = local_200.ptr.field_1.value.text.content.ptr;
            (pmVar13->branches).ptr = local_200.ptr.field_1.value.branches.ptr;
            (pmVar13->branches).size_ = local_200.ptr.field_1.value.branches.size_;
            (pmVar13->branches).disposer = local_200.ptr.field_1.value.branches.disposer;
            local_200.ptr.field_1.value.branches.ptr = (Branch *)0x0;
            local_200.ptr.field_1.value.branches.size_ = 0;
            uVar11 = local_200.ptr.field_1.value.branches.disposer;
            if (local_200.ptr.field_1.value.text.content.ptr != (char *)0x0) {
              local_200.ptr.field_1.value.text.content.ptr = (char *)0x0;
              local_200.ptr.field_1.value.text.content.size_ = 0;
              iVar10 = (**(local_200.ptr.field_1.value.text.content.disposer)->_vptr_ArrayDisposer)
                                 (local_200.ptr.field_1.value.text.content.disposer,uVar8,1,uVar9,
                                  uVar9);
              uVar11 = CONCAT44(extraout_var_01,iVar10);
            }
          }
          index_00 = index_00 + 1;
        } while (local_e0.list.reader.elementCount != index_00);
      }
    }
    else if (uVar2 == 3) {
      local_130.raw = (RawBrandedSchema *)Schema::asInterface(&local_178);
      InterfaceSchema::getSuperclasses(&local_e0,(InterfaceSchema *)&local_130);
      if ((ulong)local_e0.list.reader.elementCount != 0) {
        uVar16 = 0;
        do {
          local_170.raw =
               (RawBrandedSchema *)(CONCAT44(local_170.raw._4_4_,(uint)uVar16) | 0x4000000);
          SVar14.raw = (RawBrandedSchema *)
                       InterfaceSchema::SuperclassList::operator[](&local_e0,(uint)uVar16);
          makeBrandDepInitializer(&local_200,this,SVar14);
          local_1c0[0] = local_200.ptr.isSet;
          if (local_200.ptr.isSet == true) {
            local_1c0._8_8_ = local_200.ptr.field_1.value.size_;
            local_1b0._0_8_ = local_200.ptr.field_1.value.text.content.ptr;
            local_1b0._8_8_ = local_200.ptr.field_1.value.text.content.size_;
            local_200.ptr.field_1.value.text.content.ptr = (char *)0x0;
            local_200.ptr.field_1.value.text.content.size_ = 0;
            local_1b0._16_8_ = local_200.ptr.field_1.value.text.content.disposer;
            local_1b0._24_8_ = local_200.ptr.field_1.value.branches.ptr;
            local_1b0._32_8_ = local_200.ptr.field_1.value.branches.size_;
            local_1b0._40_8_ = local_200.ptr.field_1.value.branches.disposer;
            pmVar13 = std::
                      map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
                      ::operator[](local_180,(key_type_conflict *)&local_170);
            pmVar13->size_ = local_1c0._8_8_;
            pcVar3 = (pmVar13->text).content.ptr;
            if (pcVar3 != (char *)0x0) {
              sVar4 = (pmVar13->text).content.size_;
              (pmVar13->text).content.ptr = (char *)0x0;
              (pmVar13->text).content.size_ = 0;
              pAVar5 = (pmVar13->text).content.disposer;
              (**pAVar5->_vptr_ArrayDisposer)(pAVar5,pcVar3,1,sVar4,sVar4,0);
            }
            (pmVar13->text).content.ptr = (char *)local_1b0._0_8_;
            (pmVar13->text).content.size_ = local_1b0._8_8_;
            (pmVar13->text).content.disposer = (ArrayDisposer *)local_1b0._16_8_;
            local_1b0._0_8_ = (SegmentReader *)0x0;
            local_1b0._8_8_ = (WirePointer *)0x0;
            pBVar6 = (pmVar13->branches).ptr;
            if (pBVar6 != (Branch *)0x0) {
              sVar4 = (pmVar13->branches).size_;
              (pmVar13->branches).ptr = (Branch *)0x0;
              (pmVar13->branches).size_ = 0;
              pAVar5 = (pmVar13->branches).disposer;
              (**pAVar5->_vptr_ArrayDisposer)(pAVar5,pBVar6,0x40,sVar4,sVar4);
            }
            uVar8 = local_1b0._8_8_;
            uVar11 = local_1b0._0_8_;
            (pmVar13->branches).ptr = (Branch *)local_1b0._24_8_;
            (pmVar13->branches).size_ = local_1b0._32_8_;
            (pmVar13->branches).disposer = (ArrayDisposer *)local_1b0._40_8_;
            local_1b0._24_8_ = (WirePointer *)0x0;
            local_1b0._32_4_ = 0;
            local_1b0._36_2_ = 0;
            local_1b0._38_2_ = 0;
            if ((SegmentReader *)local_1b0._0_8_ != (SegmentReader *)0x0) {
              local_1b0._0_8_ = (SegmentReader *)0x0;
              local_1b0._8_8_ = (WirePointer *)0x0;
              (***(_func_int ***)local_1b0._16_8_)(local_1b0._16_8_,uVar11,1,uVar8,uVar8);
            }
          }
          uVar16 = uVar16 + 1;
        } while (local_e0.list.reader.elementCount != uVar16);
      }
      uVar11 = InterfaceSchema::getMethods(&local_68,(InterfaceSchema *)&local_130);
      if ((ulong)local_68.list.reader.elementCount != 0) {
        uVar16 = 0;
        do {
          SVar7.raw._4_4_ = local_68.parent.super_Schema.raw._4_4_;
          SVar7.raw._0_4_ = (uint)local_68.parent.super_Schema.raw;
          index = (ElementCount)uVar16;
          _::ListReader::getStructElement((StructReader *)local_1b0,&local_68.list.reader,index);
          uVar11 = local_1c0._8_8_;
          uStack_120 = (undefined2)uVar16;
          local_1c0._8_2_ = uStack_120;
          uVar8 = local_1c0._8_8_;
          local_204 = index | 0x2000000;
          local_118 = (SegmentReader *)local_1b0._0_8_;
          pWStack_110 = (WirePointer *)local_1b0._8_8_;
          local_108 = (ArrayDisposer *)local_1b0._16_8_;
          pWStack_100 = (WirePointer *)local_1b0._24_8_;
          local_f8 = local_1b0._32_4_;
          SStack_f4 = local_1b0._36_2_;
          uStack_f2 = local_1b0._38_2_;
          pMStack_f0 = (MethodList *)local_1b0._40_8_;
          local_1c0._10_4_ = SUB84(uVar11,2);
          uStack_11e = local_1c0._10_4_;
          local_1c0._14_2_ = SUB82(uVar11,6);
          uStack_11a = local_1c0._14_2_;
          local_1c0._0_8_ = SVar7.raw;
          local_1c0._8_8_ = uVar8;
          local_128 = SVar7.raw;
          SVar15 = InterfaceSchema::Method::getParamType((Method *)local_1c0);
          method_00._10_4_ = uStack_11e;
          method_00.ordinal = uStack_120;
          method_00._14_2_ = uStack_11a;
          method_00.parent.super_Schema.raw = (Schema)(Schema)local_128;
          method_00.proto._reader.segment = local_118;
          method_00.proto._reader.capTable = (CapTableReader *)pWStack_110;
          method_00.proto._reader.data = local_108;
          method_00.proto._reader.pointers = pWStack_100;
          method_00.proto._reader.dataSize = local_f8;
          method_00.proto._reader.pointerCount = SStack_f4;
          method_00.proto._reader._38_2_ = uStack_f2;
          method_00.proto._reader._40_8_ = pMStack_f0;
          suffix.content.size_ = 7;
          suffix.content.ptr = "Params";
          makeBrandDepInitializer((Maybe<kj::StringTree> *)&local_170,this,method_00,SVar15,suffix);
          local_200.ptr.isSet = local_170.raw._0_1_;
          if (local_170.raw._0_1_ == true) {
            local_200.ptr.field_1.value.size_ = local_168.value.size_;
            local_200.ptr.field_1.value.text.content.ptr = local_168.value.text.content.ptr;
            local_200.ptr.field_1.value.text.content.size_ = local_168.value.text.content.size_;
            local_168.value.text.content.ptr = (char *)0x0;
            local_168.value.text.content.size_ = 0;
            local_200.ptr.field_1.value.text.content.disposer =
                 local_168.value.text.content.disposer;
            local_200.ptr.field_1.value.branches.ptr = local_168.value.branches.ptr;
            local_200.ptr.field_1.value.branches.size_ = local_168.value.branches.size_;
            local_200.ptr.field_1.value.branches.disposer = local_168.value.branches.disposer;
            pmVar13 = std::
                      map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
                      ::operator[](local_180,&local_204);
            pmVar13->size_ = local_200.ptr.field_1.value.size_;
            pcVar3 = (pmVar13->text).content.ptr;
            if (pcVar3 != (char *)0x0) {
              sVar4 = (pmVar13->text).content.size_;
              (pmVar13->text).content.ptr = (char *)0x0;
              (pmVar13->text).content.size_ = 0;
              pAVar5 = (pmVar13->text).content.disposer;
              (**pAVar5->_vptr_ArrayDisposer)(pAVar5,pcVar3,1,sVar4,sVar4,0);
            }
            (pmVar13->text).content.ptr = local_200.ptr.field_1.value.text.content.ptr;
            (pmVar13->text).content.size_ = local_200.ptr.field_1.value.text.content.size_;
            (pmVar13->text).content.disposer = local_200.ptr.field_1.value.text.content.disposer;
            local_200.ptr.field_1.value.text.content.ptr = (char *)0x0;
            local_200.ptr.field_1.value.text.content.size_ = 0;
            pBVar6 = (pmVar13->branches).ptr;
            if (pBVar6 != (Branch *)0x0) {
              sVar4 = (pmVar13->branches).size_;
              (pmVar13->branches).ptr = (Branch *)0x0;
              (pmVar13->branches).size_ = 0;
              pAVar5 = (pmVar13->branches).disposer;
              (**pAVar5->_vptr_ArrayDisposer)(pAVar5,pBVar6,0x40,sVar4,sVar4);
            }
            uVar8 = local_200.ptr.field_1.value.text.content.size_;
            uVar11 = local_200.ptr.field_1.value.text.content.ptr;
            (pmVar13->branches).ptr = local_200.ptr.field_1.value.branches.ptr;
            (pmVar13->branches).size_ = local_200.ptr.field_1.value.branches.size_;
            (pmVar13->branches).disposer = local_200.ptr.field_1.value.branches.disposer;
            local_200.ptr.field_1.value.branches.ptr = (Branch *)0x0;
            local_200.ptr.field_1.value.branches.size_ = 0;
            if (local_200.ptr.field_1.value.text.content.ptr != (char *)0x0) {
              local_200.ptr.field_1.value.text.content.ptr = (char *)0x0;
              local_200.ptr.field_1.value.text.content.size_ = 0;
              (**(local_200.ptr.field_1.value.text.content.disposer)->_vptr_ArrayDisposer)
                        (local_200.ptr.field_1.value.text.content.disposer,uVar11,1,uVar8,uVar8);
            }
          }
          local_204 = index | 0x3000000;
          local_a8 = (RawBrandedSchema *)local_1c0._0_8_;
          pCStack_a0 = (CapTableReader *)local_1c0._8_8_;
          local_98 = (SegmentReader *)local_1b0._0_8_;
          pWStack_90 = (WirePointer *)local_1b0._8_8_;
          local_88 = (ArrayDisposer *)local_1b0._16_8_;
          pWStack_80 = (WirePointer *)local_1b0._24_8_;
          local_78 = local_1b0._32_4_;
          SStack_74 = local_1b0._36_2_;
          uStack_72 = local_1b0._38_2_;
          pMStack_70 = (MethodList *)local_1b0._40_8_;
          SVar15 = InterfaceSchema::Method::getResultType((Method *)local_1c0);
          method_01._8_8_ = pCStack_a0;
          method_01.parent.super_Schema.raw = (Schema)(Schema)local_a8;
          method_01.proto._reader.segment = local_98;
          method_01.proto._reader.capTable = (CapTableReader *)pWStack_90;
          method_01.proto._reader.data = local_88;
          method_01.proto._reader.pointers = pWStack_80;
          method_01.proto._reader.dataSize = local_78;
          method_01.proto._reader.pointerCount = SStack_74;
          method_01.proto._reader._38_2_ = uStack_72;
          method_01.proto._reader._40_8_ = pMStack_70;
          suffix_00.content.size_ = 8;
          suffix_00.content.ptr = "Results";
          pMVar12 = makeBrandDepInitializer
                              ((Maybe<kj::StringTree> *)&local_170,this,method_01,SVar15,suffix_00);
          local_200.ptr.isSet = local_170.raw._0_1_;
          uVar11 = (MethodList *)CONCAT71((int7)((ulong)pMVar12 >> 8),local_170.raw._0_1_);
          if (local_170.raw._0_1_ == true) {
            local_200.ptr.field_1.value.size_ = local_168.value.size_;
            local_200.ptr.field_1.value.text.content.ptr = local_168.value.text.content.ptr;
            local_200.ptr.field_1.value.text.content.size_ = local_168.value.text.content.size_;
            local_168.value.text.content.ptr = (char *)0x0;
            local_168.value.text.content.size_ = 0;
            local_200.ptr.field_1.value.text.content.disposer =
                 local_168.value.text.content.disposer;
            local_200.ptr.field_1.value.branches.ptr = local_168.value.branches.ptr;
            local_200.ptr.field_1.value.branches.size_ = local_168.value.branches.size_;
            local_200.ptr.field_1.value.branches.disposer = local_168.value.branches.disposer;
            pmVar13 = std::
                      map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
                      ::operator[](local_180,&local_204);
            pmVar13->size_ = local_200.ptr.field_1.value.size_;
            pcVar3 = (pmVar13->text).content.ptr;
            if (pcVar3 != (char *)0x0) {
              sVar4 = (pmVar13->text).content.size_;
              (pmVar13->text).content.ptr = (char *)0x0;
              (pmVar13->text).content.size_ = 0;
              pAVar5 = (pmVar13->text).content.disposer;
              (**pAVar5->_vptr_ArrayDisposer)(pAVar5,pcVar3,1,sVar4,sVar4);
            }
            (pmVar13->text).content.ptr = local_200.ptr.field_1.value.text.content.ptr;
            (pmVar13->text).content.size_ = local_200.ptr.field_1.value.text.content.size_;
            (pmVar13->text).content.disposer = local_200.ptr.field_1.value.text.content.disposer;
            local_200.ptr.field_1.value.text.content.ptr = (char *)0x0;
            local_200.ptr.field_1.value.text.content.size_ = 0;
            pBVar6 = (pmVar13->branches).ptr;
            if (pBVar6 != (Branch *)0x0) {
              sVar4 = (pmVar13->branches).size_;
              (pmVar13->branches).ptr = (Branch *)0x0;
              (pmVar13->branches).size_ = 0;
              pAVar5 = (pmVar13->branches).disposer;
              (**pAVar5->_vptr_ArrayDisposer)(pAVar5,pBVar6,0x40,sVar4,sVar4);
            }
            uVar9 = local_200.ptr.field_1.value.text.content.size_;
            uVar8 = local_200.ptr.field_1.value.text.content.ptr;
            (pmVar13->branches).ptr = local_200.ptr.field_1.value.branches.ptr;
            (pmVar13->branches).size_ = local_200.ptr.field_1.value.branches.size_;
            (pmVar13->branches).disposer = local_200.ptr.field_1.value.branches.disposer;
            local_200.ptr.field_1.value.branches.ptr = (Branch *)0x0;
            local_200.ptr.field_1.value.branches.size_ = 0;
            uVar11 = local_200.ptr.field_1.value.branches.disposer;
            if (local_200.ptr.field_1.value.text.content.ptr != (char *)0x0) {
              local_200.ptr.field_1.value.text.content.ptr = (char *)0x0;
              local_200.ptr.field_1.value.text.content.size_ = 0;
              iVar10 = (**(local_200.ptr.field_1.value.text.content.disposer)->_vptr_ArrayDisposer)
                                 (local_200.ptr.field_1.value.text.content.disposer,uVar8,1,uVar9,
                                  uVar9);
              uVar11 = CONCAT44(extraout_var_00,iVar10);
            }
          }
          uVar16 = uVar16 + 1;
        } while (local_68.list.reader.elementCount != uVar16);
      }
    }
    else {
      uVar11 = (MethodList *)(ulong)uVar2;
      if (uVar2 == 4) {
        local_e0.parent.super_Schema.raw._0_4_ = 0x5000000;
        local_170.raw = (RawBrandedSchema *)Schema::asConst(&local_178);
        TVar17 = ConstSchema::getType((ConstSchema *)&local_170);
        pMVar12 = makeBrandDepInitializer(&local_200,this,TVar17);
        local_1c0[0] = local_200.ptr.isSet;
        uVar11 = (MethodList *)CONCAT71((int7)((ulong)pMVar12 >> 8),local_200.ptr.isSet);
        if (local_200.ptr.isSet == true) {
          local_1c0._8_8_ = local_200.ptr.field_1.value.size_;
          local_1b0._0_8_ = local_200.ptr.field_1.value.text.content.ptr;
          local_1b0._8_8_ = local_200.ptr.field_1.value.text.content.size_;
          local_1b0._16_8_ = local_200.ptr.field_1.value.text.content.disposer;
          local_1b0._24_8_ = local_200.ptr.field_1.value.branches.ptr;
          local_1b0._32_8_ = local_200.ptr.field_1.value.branches.size_;
          local_1b0._40_8_ = local_200.ptr.field_1.value.branches.disposer;
          pmVar13 = std::
                    map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
                    ::operator[](local_180,(key_type_conflict *)&local_e0);
          pmVar13->size_ = local_1c0._8_8_;
          pcVar3 = (pmVar13->text).content.ptr;
          if (pcVar3 != (char *)0x0) {
            sVar4 = (pmVar13->text).content.size_;
            (pmVar13->text).content.ptr = (char *)0x0;
            (pmVar13->text).content.size_ = 0;
            pAVar5 = (pmVar13->text).content.disposer;
            (**pAVar5->_vptr_ArrayDisposer)(pAVar5,pcVar3,1,sVar4,sVar4,0);
          }
          (pmVar13->text).content.ptr = (char *)local_1b0._0_8_;
          (pmVar13->text).content.size_ = local_1b0._8_8_;
          (pmVar13->text).content.disposer = (ArrayDisposer *)local_1b0._16_8_;
          local_1b0._0_8_ = (SegmentReader *)0x0;
          local_1b0._8_8_ = (WirePointer *)0x0;
          pBVar6 = (pmVar13->branches).ptr;
          if (pBVar6 != (Branch *)0x0) {
            sVar4 = (pmVar13->branches).size_;
            (pmVar13->branches).ptr = (Branch *)0x0;
            (pmVar13->branches).size_ = 0;
            pAVar5 = (pmVar13->branches).disposer;
            (**pAVar5->_vptr_ArrayDisposer)
                      (pAVar5,pBVar6,0x40,sVar4,sVar4,
                       kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
          }
          uVar9 = local_1b0._8_8_;
          uVar8 = local_1b0._0_8_;
          (pmVar13->branches).ptr = (Branch *)local_1b0._24_8_;
          (pmVar13->branches).size_ = local_1b0._32_8_;
          (pmVar13->branches).disposer = (ArrayDisposer *)local_1b0._40_8_;
          local_1b0._24_8_ = (WirePointer *)0x0;
          local_1b0._32_4_ = 0;
          local_1b0._36_2_ = 0;
          local_1b0._38_2_ = 0;
          uVar11 = local_1b0._40_8_;
          if ((SegmentReader *)local_1b0._0_8_ != (SegmentReader *)0x0) {
            local_1b0._0_8_ = (SegmentReader *)0x0;
            local_1b0._8_8_ = (WirePointer *)0x0;
            iVar10 = (***(_func_int ***)local_1b0._16_8_)(local_1b0._16_8_,uVar8,1,uVar9,uVar9,0);
            uVar11 = CONCAT44(extraout_var,iVar10);
          }
        }
      }
    }
  }
  return (map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
          *)uVar11;
}

Assistant:

std::map<uint, kj::StringTree>
  makeBrandDepMap(const TemplateContext& templateContext, Schema schema) {
    // Build deps. This is separate from makeBrandDepInitializers to give calling code the
    // opportunity to count the number of dependencies, to calculate array sizes.
    std::map<uint, kj::StringTree> depMap;

#define ADD_DEP(kind, index, ...) \
    { \
      uint location = _::RawBrandedSchema::makeDepLocation( \
          _::RawBrandedSchema::DepKind::kind, index); \
      KJ_IF_MAYBE(dep, makeBrandDepInitializer(__VA_ARGS__)) { \
        depMap[location] = kj::mv(*dep); \
      } \
    }

    switch (schema.getProto().which()) {
      case schema::Node::FILE:
      case schema::Node::ENUM:
      case schema::Node::ANNOTATION:
        break;

      case schema::Node::STRUCT:
        for (auto field: schema.asStruct().getFields()) {
          ADD_DEP(FIELD, field.getIndex(), field.getType());
        }
        break;
      case schema::Node::INTERFACE: {
        auto interface = schema.asInterface();
        auto superclasses = interface.getSuperclasses();
        for (auto i: kj::indices(superclasses)) {
          ADD_DEP(SUPERCLASS, i, superclasses[i]);
        }
        auto methods = interface.getMethods();
        for (auto i: kj::indices(methods)) {
          auto method = methods[i];
          ADD_DEP(METHOD_PARAMS, i, method, method.getParamType(), "Params");
          ADD_DEP(METHOD_RESULTS, i, method, method.getResultType(), "Results");
        }
        break;
      }
      case schema::Node::CONST:
        ADD_DEP(CONST_TYPE, 0, schema.asConst().getType());
        break;
    }
#undef ADD_DEP
    return depMap;
  }